

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_zip.c
# Opt level: O0

wchar_t archive_read_format_zip_read_data(archive_read *a,void **buff,size_t *size,int64_t *offset)

{
  char cVar1;
  long lVar2;
  char *pcVar3;
  undefined8 uVar4;
  size_t *in_RCX;
  void **in_RDX;
  archive_read *in_RSI;
  archive *in_RDI;
  zip *zip;
  wchar_t r;
  int64_t in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc4;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd4;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  wchar_t wVar5;
  
  lVar2 = *(long *)in_RDI[0x15].archive_format_name;
  if (*(int *)(lVar2 + 0x58) == -1) {
    *(undefined4 *)(lVar2 + 0x58) = 0;
  }
  *in_RCX = *(size_t *)(lVar2 + 0xa8);
  *in_RDX = (void *)0x0;
  (in_RSI->archive).magic = 0;
  (in_RSI->archive).state = 0;
  if (*(char *)(lVar2 + 0xc2) == '\0') {
    if ((*(ushort *)(*(long *)(lVar2 + 0x90) + 0x7c) & 0xf000) == 0x8000) {
      if ((*(ushort *)(*(long *)(lVar2 + 0x90) + 0x7e) & 0x41) == 0) {
        __archive_read_consume
                  ((archive_read *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                   in_stack_ffffffffffffffb8);
        *(undefined8 *)(lVar2 + 0x88) = 0;
        cVar1 = *(char *)(*(long *)(lVar2 + 0x90) + 0x80);
        if (cVar1 == '\0') {
          wVar5 = zip_read_data_none(in_RSI,in_RDX,in_RCX,
                                     (int64_t *)
                                     CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0));
        }
        else {
          if (cVar1 != '\b') {
            pcVar3 = compression_name((uint)*(byte *)(*(long *)(lVar2 + 0x90) + 0x80));
            archive_set_error(in_RDI,0x54,"Unsupported ZIP compression method (%s)",pcVar3);
            return L'\xffffffe7';
          }
          wVar5 = zip_read_data_deflate
                            ((archive_read *)
                             CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),
                             (void **)in_RDI,(size_t *)in_RSI,(int64_t *)in_RDX);
        }
        if (wVar5 == L'\0') {
          if (*in_RDX != (void *)0x0) {
            uVar4._0_4_ = (in_RSI->archive).magic;
            uVar4._4_4_ = (in_RSI->archive).state;
            uVar4 = (**(code **)(lVar2 + 0xb8))
                              (*(undefined8 *)(lVar2 + 0xb0),uVar4,(ulong)*in_RDX & 0xffffffff);
            *(undefined8 *)(lVar2 + 0xb0) = uVar4;
          }
          if (*(char *)(lVar2 + 0xc2) != '\0') {
            if (*(long *)(*(long *)(lVar2 + 0x90) + 0x28) != *(long *)(lVar2 + 0xa0)) {
              archive_set_error(in_RDI,-1,
                                "ZIP compressed data is wrong size (read %jd, expected %jd)",
                                *(undefined8 *)(lVar2 + 0xa0),
                                *(undefined8 *)(*(long *)(lVar2 + 0x90) + 0x28));
              return L'\xffffffec';
            }
            if ((*(ulong *)(*(long *)(lVar2 + 0x90) + 0x30) & 0xffffffff) !=
                (*(ulong *)(lVar2 + 0xa8) & 0xffffffff)) {
              archive_set_error(in_RDI,-1,
                                "ZIP uncompressed data is wrong size (read %jd, expected %jd)\n",
                                *(undefined8 *)(lVar2 + 0xa8),
                                *(undefined8 *)(*(long *)(lVar2 + 0x90) + 0x30));
              return L'\xffffffec';
            }
            if (((ulong)*(uint *)(*(long *)(lVar2 + 0x90) + 0x78) != *(ulong *)(lVar2 + 0xb0)) &&
               (*(char *)(lVar2 + 0xc0) == '\0')) {
              archive_set_error(in_RDI,-1,"ZIP bad CRC: 0x%lx should be 0x%lx",
                                *(undefined8 *)(lVar2 + 0xb0),
                                (ulong)*(uint *)(*(long *)(lVar2 + 0x90) + 0x78));
              return L'\xffffffec';
            }
          }
          wVar5 = L'\0';
        }
      }
      else {
        *(undefined4 *)(lVar2 + 0x58) = 1;
        archive_set_error(in_RDI,0x54,"Encrypted file is unsupported");
        wVar5 = L'\xffffffe7';
      }
    }
    else {
      wVar5 = L'\x01';
    }
  }
  else {
    wVar5 = L'\x01';
  }
  return wVar5;
}

Assistant:

static int
archive_read_format_zip_read_data(struct archive_read *a,
    const void **buff, size_t *size, int64_t *offset)
{
	int r;
	struct zip *zip = (struct zip *)(a->format->data);

	if (zip->has_encrypted_entries == ARCHIVE_READ_FORMAT_ENCRYPTION_DONT_KNOW) {
		zip->has_encrypted_entries = 0;
	}

	*offset = zip->entry_uncompressed_bytes_read;
	*size = 0;
	*buff = NULL;

	/* If we hit end-of-entry last time, return ARCHIVE_EOF. */
	if (zip->end_of_entry)
		return (ARCHIVE_EOF);

	/* Return EOF immediately if this is a non-regular file. */
	if (AE_IFREG != (zip->entry->mode & AE_IFMT))
		return (ARCHIVE_EOF);

	if (zip->entry->zip_flags & (ZIP_ENCRYPTED | ZIP_STRONG_ENCRYPTED)) {
		zip->has_encrypted_entries = 1;
		archive_set_error(&a->archive, ARCHIVE_ERRNO_FILE_FORMAT,
		    "Encrypted file is unsupported");
		return (ARCHIVE_FAILED);
	}

	__archive_read_consume(a, zip->unconsumed);
	zip->unconsumed = 0;

	switch(zip->entry->compression) {
	case 0:  /* No compression. */
		r =  zip_read_data_none(a, buff, size, offset);
		break;
#ifdef HAVE_ZLIB_H
	case 8: /* Deflate compression. */
		r =  zip_read_data_deflate(a, buff, size, offset);
		break;
#endif
	default: /* Unsupported compression. */
		/* Return a warning. */
		archive_set_error(&a->archive, ARCHIVE_ERRNO_FILE_FORMAT,
		    "Unsupported ZIP compression method (%s)",
		    compression_name(zip->entry->compression));
		/* We can't decompress this entry, but we will
		 * be able to skip() it and try the next entry. */
		return (ARCHIVE_FAILED);
		break;
	}
	if (r != ARCHIVE_OK)
		return (r);
	/* Update checksum */
	if (*size)
		zip->entry_crc32 = zip->crc32func(zip->entry_crc32, *buff,
		    (unsigned)*size);
	/* If we hit the end, swallow any end-of-data marker. */
	if (zip->end_of_entry) {
		/* Check file size, CRC against these values. */
		if (zip->entry->compressed_size !=
		    zip->entry_compressed_bytes_read) {
			archive_set_error(&a->archive, ARCHIVE_ERRNO_MISC,
			    "ZIP compressed data is wrong size "
			    "(read %jd, expected %jd)",
			    (intmax_t)zip->entry_compressed_bytes_read,
			    (intmax_t)zip->entry->compressed_size);
			return (ARCHIVE_WARN);
		}
		/* Size field only stores the lower 32 bits of the actual
		 * size. */
		if ((zip->entry->uncompressed_size & UINT32_MAX)
		    != (zip->entry_uncompressed_bytes_read & UINT32_MAX)) {
			archive_set_error(&a->archive, ARCHIVE_ERRNO_MISC,
			    "ZIP uncompressed data is wrong size "
			    "(read %jd, expected %jd)\n",
			    (intmax_t)zip->entry_uncompressed_bytes_read,
			    (intmax_t)zip->entry->uncompressed_size);
			return (ARCHIVE_WARN);
		}
		/* Check computed CRC against header */
		if (zip->entry->crc32 != zip->entry_crc32
		    && !zip->ignore_crc32) {
			archive_set_error(&a->archive, ARCHIVE_ERRNO_MISC,
			    "ZIP bad CRC: 0x%lx should be 0x%lx",
			    (unsigned long)zip->entry_crc32,
			    (unsigned long)zip->entry->crc32);
			return (ARCHIVE_WARN);
		}
	}

	return (ARCHIVE_OK);
}